

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAdvancedBlendTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AdvancedBlendCase::AdvancedBlendCase
          (AdvancedBlendCase *this,Context *context,char *name,char *desc,deUint32 mode,
          int overdrawCount,bool coherent,RenderTargetType rtType)

{
  int iVar1;
  RenderTarget *pRVar2;
  int iVar3;
  undefined3 in_stack_00000009;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AdvancedBlendCase_02161ab0;
  this->m_blendMode = (deUint32)desc;
  this->m_overdrawCount = mode;
  this->m_coherentBlending = SUB41(overdrawCount,0);
  this->m_rtType = _coherent;
  this->m_numIters = 5;
  this->m_colorRbo = 0;
  this->m_fbo = 0;
  this->m_resolveColorRbo = 0;
  this->m_resolveFbo = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  if (_coherent == RENDERTARGETTYPE_DEFAULT) {
    pRVar2 = Context::getRenderTarget(context);
    this->m_renderWidth = pRVar2->m_width;
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = pRVar2->m_height;
    iVar3 = this->m_renderWidth;
  }
  else {
    this->m_renderWidth = 0x100;
    iVar3 = 0x100;
    iVar1 = 0x100;
  }
  this->m_renderHeight = iVar1;
  if (0x7f < iVar3) {
    iVar3 = 0x80;
  }
  this->m_viewportWidth = iVar3;
  iVar3 = 0x80;
  if (iVar1 < 0x80) {
    iVar3 = iVar1;
  }
  this->m_viewportHeight = iVar3;
  this->m_iterNdx = 0;
  return;
}

Assistant:

AdvancedBlendCase::AdvancedBlendCase (Context&			context,
									  const char*		name,
									  const char*		desc,
									  deUint32			mode,
									  int				overdrawCount,
									  bool				coherent,
									  RenderTargetType	rtType)
	: TestCase				(context, name, desc)
	, m_blendMode			(mode)
	, m_overdrawCount		(overdrawCount)
	, m_coherentBlending	(coherent)
	, m_rtType				(rtType)
	, m_numIters			(5)
	, m_colorRbo			(0)
	, m_fbo					(0)
	, m_resolveColorRbo		(0)
	, m_resolveFbo			(0)
	, m_program				(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_renderWidth			(rtType != RENDERTARGETTYPE_DEFAULT ? 2*MAX_VIEWPORT_WIDTH	: m_context.getRenderTarget().getWidth())
	, m_renderHeight		(rtType != RENDERTARGETTYPE_DEFAULT ? 2*MAX_VIEWPORT_HEIGHT	: m_context.getRenderTarget().getHeight())
	, m_viewportWidth		(de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH))
	, m_viewportHeight		(de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT))
	, m_iterNdx				(0)
{
}